

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O0

void __thiscall
onmt::Tokenizer::tokenize
          (Tokenizer *this,string *text,
          vector<onmt::Token,_std::allocator<onmt::Token>_> *annotated_tokens,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *alphabets,bool training)

{
  bool bVar1;
  ulong uVar2;
  element_type *peVar3;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *in_RDX;
  __normal_iterator<onmt::Token_*,_std::vector<onmt::Token,_std::allocator<onmt::Token>_>_> *in_RDI;
  byte in_R8B;
  Token *token;
  iterator __end2;
  iterator __begin2;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *__range2;
  string *in_stack_00000180;
  string *in_stack_00000188;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_stack_00000218;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *in_stack_00000220;
  string *in_stack_00000228;
  Tokenizer *in_stack_00000230;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *this_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_onmt::Casing>
  *in_stack_ffffffffffffff68;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff88;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *in_stack_ffffffffffffff90;
  __normal_iterator<onmt::Token_*,_std::vector<onmt::Token,_std::allocator<onmt::Token>_>_> local_38
  ;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *local_30;
  byte local_21;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *local_18;
  
  local_21 = in_R8B & 1;
  local_18 = in_RDX;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    this_00 = local_18;
    std::__cxx11::string::size();
    std::vector<onmt::Token,_std::allocator<onmt::Token>_>::reserve
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (*(int *)&in_RDI[1]._M_current == 3 || *(int *)&in_RDI[1]._M_current == 4) {
      tokenize_on_placeholders
                ((Tokenizer *)__begin2._M_current,&(__end2._M_current)->surface,
                 (vector<onmt::Token,_std::allocator<onmt::Token>_> *)token);
    }
    else {
      tokenize_text(in_stack_00000230,in_stack_00000228,in_stack_00000220,in_stack_00000218);
    }
    if ((((ulong)in_RDI[6]._M_current & 0x10000) != 0) ||
       (((ulong)in_RDI[6]._M_current & 0x100) != 0)) {
      local_30 = local_18;
      local_38._M_current =
           (Token *)std::vector<onmt::Token,_std::allocator<onmt::Token>_>::begin(this_00);
      std::vector<onmt::Token,_std::allocator<onmt::Token>_>::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (in_RDI,(__normal_iterator<onmt::Token_*,_std::vector<onmt::Token,_std::allocator<onmt::Token>_>_>
                                        *)this_00), bVar1) {
        __gnu_cxx::
        __normal_iterator<onmt::Token_*,_std::vector<onmt::Token,_std::allocator<onmt::Token>_>_>::
        operator*(&local_38);
        bVar1 = Token::is_placeholder((Token *)0x3c3bd0);
        if (!bVar1) {
          lowercase_token(in_stack_00000188,in_stack_00000180);
          std::tie<std::__cxx11::string,onmt::Casing>
                    (&in_stack_ffffffffffffff68->first,(Casing *)in_RDI);
          std::tuple<std::__cxx11::string&,onmt::Casing&>::operator=
                    ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_onmt::Casing_&>
                      *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_onmt::Casing>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_onmt::Casing>
                   *)0x3c3c21);
        }
        __gnu_cxx::
        __normal_iterator<onmt::Token_*,_std::vector<onmt::Token,_std::allocator<onmt::Token>_>_>::
        operator++(&local_38);
      }
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x16));
    if (bVar1) {
      peVar3 = std::
               __shared_ptr_access<const_onmt::SubwordEncoder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_onmt::SubwordEncoder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x3c3c5c);
      (*peVar3->_vptr_SubwordEncoder[8])
                (&stack0xffffffffffffff68,peVar3,local_18,(ulong)(local_21 & 1));
      std::vector<onmt::Token,_std::allocator<onmt::Token>_>::operator=
                (in_stack_ffffffffffffff70,
                 (vector<onmt::Token,_std::allocator<onmt::Token>_> *)in_stack_ffffffffffffff68);
      std::vector<onmt::Token,_std::allocator<onmt::Token>_>::~vector(in_stack_ffffffffffffff70);
    }
  }
  return;
}

Assistant:

void Tokenizer::tokenize(const std::string& text,
                           std::vector<Token>& annotated_tokens,
                           std::unordered_map<std::string, size_t>* alphabets,
                           bool training) const
  {
    if (text.empty())
      return;

    annotated_tokens.reserve(text.size());

    switch (_options.mode)
    {
    case Mode::None:
    case Mode::Space:
      tokenize_on_placeholders(text, annotated_tokens);
      break;
    default:
      tokenize_text(text, annotated_tokens, alphabets);
      break;
    }

    if (_options.case_markup || _options.case_feature)
    {
      for (auto& token : annotated_tokens)
      {
        if (!token.is_placeholder())
          std::tie(token.surface, token.casing) = lowercase_token(token.surface, _options.lang);
      }
    }

    if (_subword_encoder)
      annotated_tokens = _subword_encoder->encode_and_annotate(annotated_tokens, training);
  }